

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O0

GLuint hmi::anon_unknown_0::compile_shader(char *code,GLenum type)

{
  PFNGLGETSHADERINFOLOGPROC p_Var1;
  GLint GVar2;
  GLuint GVar3;
  pointer pcVar4;
  ostream *this;
  ostream *this_00;
  GLenum in_ESI;
  GLchar *in_RDI;
  unique_ptr<char[],_std::default_delete<char[]>_> info_log;
  GLint info_log_length;
  GLint compile_status;
  char *source [1];
  GLuint id;
  char *in_stack_ffffffffffffff98;
  unique_ptr<char[],_std::default_delete<char[]>_> *in_stack_ffffffffffffffa0;
  GLint local_28;
  GLint local_24;
  GLchar *local_20;
  GLuint local_18;
  GLchar *local_10;
  GLuint local_4;
  
  local_10 = in_RDI;
  local_18 = (*glad_glCreateShader)(in_ESI);
  if (local_18 == 0) {
    local_4 = 0;
  }
  else {
    local_20 = local_10;
    (*glad_glShaderSource)(local_18,1,&local_20,(GLint *)0x0);
    (*glad_glCompileShader)(local_18);
    local_24 = 0;
    (*glad_glGetShaderiv)(local_18,0x8b81,&local_24);
    if (local_24 == 0) {
      local_28 = 0;
      (*glad_glGetShaderiv)(local_18,0x8b84,&local_28);
      if (local_28 < 1) {
        __assert_fail("info_log_length > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jube[P]std_hmi/src/renderer.cc"
                      ,0x46,
                      "GLuint hmi::(anonymous namespace)::compile_shader(const char *, GLenum)");
      }
      operator_new__((long)local_28);
      std::unique_ptr<char[],std::default_delete<char[]>>::
      unique_ptr<char*,std::default_delete<char[]>,void,bool>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      GVar3 = local_18;
      GVar2 = local_28;
      p_Var1 = glad_glGetShaderInfoLog;
      pcVar4 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(in_stack_ffffffffffffffa0)
      ;
      (*p_Var1)(GVar3,GVar2,(GLsizei *)0x0,pcVar4);
      this = std::operator<<((ostream *)&std::cerr,"Error while compiling shader: ");
      pcVar4 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                         ((unique_ptr<char[],_std::default_delete<char[]>_> *)this);
      this_00 = std::operator<<(this,pcVar4);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      local_4 = 0;
      std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)this);
    }
    else {
      local_4 = local_18;
    }
  }
  return local_4;
}

Assistant:

GLuint compile_shader(const char *code, GLenum type) {
      GLuint id = glCreateShader(type);

      if (id == 0) {
        return 0;
      }

      // compile
      const char *source[1] = { code };
      glShaderSource(id, 1, source, nullptr);
      glCompileShader(id);

      // and check
      GLint compile_status = GL_FALSE;
      glGetShaderiv(id, GL_COMPILE_STATUS, &compile_status);

      if (compile_status == GL_FALSE) {
        GLint info_log_length = 0;
        glGetShaderiv(id, GL_INFO_LOG_LENGTH, &info_log_length);

        assert(info_log_length > 0);
        std::unique_ptr<char[]> info_log(new char[info_log_length]);
        glGetShaderInfoLog(id, info_log_length, nullptr, info_log.get());

        std::cerr << "Error while compiling shader: " << info_log.get() << std::endl;
        return 0;
      }

      return id;
    }